

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O2

string * __thiscall
GeneratorExpressionContent::ProcessArbitraryContent
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,const_iterator pit)

{
  pointer ppcVar1;
  cmGeneratorExpressionEvaluator *pcVar2;
  int iVar3;
  pointer ppcVar4;
  pointer pvVar5;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  value_type local_d8;
  GeneratorExpressionContent *local_b8;
  cmGeneratorExpressionDAGChecker *local_b0;
  string local_a8;
  string *local_88;
  pointer local_80;
  pointer local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  pvVar5 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = this;
  local_b0 = dagChecker;
  local_88 = identifier;
  local_80 = pvVar5;
  do {
    if (pit._M_current == pvVar5) {
      iVar3 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
      if ((char)iVar3 == '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                        local_d8.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_d8._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                        local_d8.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_d8._M_string_length;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_a8._M_dataplus._M_p = (pointer)0x0;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_a8,&local_d8);
        (*node->_vptr_cmGeneratorExpressionNode[6])
                  (__return_storage_ptr__,node,&local_a8,context,local_b8,local_b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
      }
LAB_002ed7b3:
      std::__cxx11::string::~string((string *)&local_d8);
      return __return_storage_ptr__;
    }
    ppcVar4 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar1 = ((pit._M_current)->
              super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_78 = pit._M_current;
LAB_002ed699:
    pvVar5 = local_80;
    if (ppcVar4 != ppcVar1) {
      pcVar2 = *ppcVar4;
      iVar3 = (*node->_vptr_cmGeneratorExpressionNode[3])(node);
      if (((char)iVar3 == '\0') ||
         (iVar3 = (*pcVar2->_vptr_cmGeneratorExpressionEvaluator[2])(pcVar2), iVar3 == 0)) break;
      GetOriginalExpression_abi_cxx11_(&local_a8,local_b8);
      std::operator+(&local_70,"$<",local_88);
      std::operator+(&local_50,&local_70,"> expression requires literal input.");
      reportError(context,&local_a8,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_a8);
      goto LAB_002ed7a3;
    }
    pit._M_current = local_78 + 1;
    if (pit._M_current != local_80) {
      std::__cxx11::string::append((char *)&local_d8);
    }
  } while( true );
  (*pcVar2->_vptr_cmGeneratorExpressionEvaluator[3])(&local_a8,pcVar2,context,local_b0);
  std::__cxx11::string::append((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_a8);
  ppcVar4 = ppcVar4 + 1;
  if (context->HadError == true) {
LAB_002ed7a3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_002ed7b3;
  }
  goto LAB_002ed699;
}

Assistant:

std::string GeneratorExpressionContent::ProcessArbitraryContent(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator
    pit) const
{
  std::string result;

  const std::vector<
    std::vector<cmGeneratorExpressionEvaluator*>>::const_iterator pend =
    this->ParamChildren.end();
  for (; pit != pend; ++pit) {
    for (cmGeneratorExpressionEvaluator* pExprEval : *pit) {
      if (node->RequiresLiteralInput()) {
        if (pExprEval->GetType() != cmGeneratorExpressionEvaluator::Text) {
          reportError(context, this->GetOriginalExpression(),
                      "$<" + identifier +
                        "> expression requires literal input.");
          return std::string();
        }
      }
      result += pExprEval->Evaluate(context, dagChecker);
      if (context->HadError) {
        return std::string();
      }
    }
    if ((pit + 1) != pend) {
      result += ",";
    }
  }
  if (node->RequiresLiteralInput()) {
    std::vector<std::string> parameters;
    parameters.push_back(result);
    return node->Evaluate(parameters, context, this, dagChecker);
  }
  return result;
}